

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonformatutils.h
# Opt level: O0

void print_with_escapes(uchar *src,ostream *os)

{
  byte bVar1;
  _Setfill<char> _Var2;
  fmtflags __fmtfl;
  _Setw _Var3;
  ostream *poVar4;
  ostream *in_RSI;
  byte *in_RDI;
  fmtflags f;
  byte *local_8;
  
  for (local_8 = in_RDI; *local_8 != 0; local_8 = local_8 + 1) {
    bVar1 = *local_8;
    if (bVar1 == 8) {
      std::operator<<(in_RSI,'\\');
      std::operator<<(in_RSI,'b');
    }
    else if (bVar1 == 9) {
      std::operator<<(in_RSI,'\\');
      std::operator<<(in_RSI,'t');
    }
    else if (bVar1 == 10) {
      std::operator<<(in_RSI,'\\');
      std::operator<<(in_RSI,'n');
    }
    else if (bVar1 == 0xc) {
      std::operator<<(in_RSI,'\\');
      std::operator<<(in_RSI,'f');
    }
    else if (bVar1 == 0xd) {
      std::operator<<(in_RSI,'\\');
      std::operator<<(in_RSI,'r');
    }
    else if (bVar1 == 0x22) {
      std::operator<<(in_RSI,'\\');
      std::operator<<(in_RSI,'\"');
    }
    else if (bVar1 == 0x5c) {
      std::operator<<(in_RSI,'\\');
      std::operator<<(in_RSI,'\\');
    }
    else if (*local_8 < 0x20) {
      __fmtfl = std::ios_base::flags((ios_base *)(in_RSI + *(long *)(*(long *)in_RSI + -0x18)));
      poVar4 = (ostream *)std::ostream::operator<<(in_RSI,std::hex);
      _Var3 = std::setw(4);
      poVar4 = std::operator<<(poVar4,_Var3);
      _Var2 = std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,_Var2._M_c);
      std::ostream::operator<<(poVar4,(uint)*local_8);
      std::ios_base::flags((ios_base *)(in_RSI + *(long *)(*(long *)in_RSI + -0x18)),__fmtfl);
    }
    else {
      std::operator<<(in_RSI,*local_8);
    }
  }
  return;
}

Assistant:

static inline void print_with_escapes(const unsigned char *src, std::ostream &os) {
  while (*src != 0u) {
    switch (*src) {
    case '\b':
      os << '\\';
      os << 'b';
      break;
    case '\f':
      os << '\\';
      os << 'f';
      break;
    case '\n':
      os << '\\';
      os << 'n';
      break;
    case '\r':
      os << '\\';
      os << 'r';
      break;
    case '\"':
      os << '\\';
      os << '"';
      break;
    case '\t':
      os << '\\';
      os << 't';
      break;
    case '\\':
      os << '\\';
      os << '\\';
      break;
    default:
      if (*src <= 0x1F) {
        std::ios::fmtflags f(os.flags());
        os << std::hex << std::setw(4) << std::setfill('0') << static_cast<int>(*src);
        os.flags(f);
      } else {
        os << *src;
}
    }
    src++;
  }
}